

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O1

String * __thiscall
kj::str<char_const(&)[11],kj::StringTree,char_const(&)[3]>
          (String *__return_storage_ptr__,kj *this,char (*params) [11],StringTree *params_1,
          char (*params_2) [3])

{
  StringTree *local_48;
  char *local_40;
  kj *local_38;
  ArrayDisposer *local_30;
  
  local_30 = (ArrayDisposer *)strlen((char *)this);
  local_38 = this;
  local_40 = (char *)strlen((char *)params_1);
  local_48 = params_1;
  _::concat<kj::ArrayPtr<char_const>,kj::StringTree,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)params,
             (StringTree *)&local_48,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}